

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_form(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var4;
  int value;
  MOB_INDEX_DATA *pMob;
  char *in_stack_000011b0;
  flag_type *in_stack_000011b8;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  if (*in_RSI != '\0') {
    pcVar1 = *(char **)(*(long *)(in_RDI + 0x80) + 0x6c60);
    iVar3 = flag_value(in_stack_000011b8,in_stack_000011b0);
    if (iVar3 != -99) {
      uVar2 = *(ulong *)(pcVar1 + (long)(iVar3 / 0x20) * 8 + 0x128);
      _Var4 = std::pow<int,int>(0,0x787bfc);
      if ((uVar2 & (long)_Var4) == 0) {
        _Var4 = std::pow<int,int>(0,0x787c95);
        *(ulong *)(pcVar1 + (long)(iVar3 / 0x20) * 8 + 0x128) =
             (long)_Var4 | *(ulong *)(pcVar1 + (long)(iVar3 / 0x20) * 8 + 0x128);
      }
      else {
        _Var4 = std::pow<int,int>(0,0x787c27);
        in_stack_ffffffffffffffb8 = (CHAR_DATA *)((long)_Var4 ^ 0xffffffffffffffff);
        *(ulong *)(pcVar1 + (long)(iVar3 / 0x20) * 8 + 0x128) =
             (ulong)in_stack_ffffffffffffffb8 &
             *(ulong *)(pcVar1 + (long)(iVar3 / 0x20) * 8 + 0x128);
        in_stack_ffffffffffffffc0 = pcVar1;
      }
      send_to_char(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      return true;
    }
  }
  send_to_char(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return false;
}

Assistant:

bool medit_form(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int value;

	if (argument[0] != '\0')
	{
		EDIT_MOB(ch, pMob);

		value = flag_value(form_flags, argument);

		if (value != NO_FLAG)
		{
			TOGGLE_BIT(pMob->form, value);
			send_to_char("Form toggled.\n\r", ch);
			return true;
		}
	}

	send_to_char("Syntax: form [flags]\n\r"\
				 "Type '? form' for a list of flags.\n\r",
				 ch);
	return false;
}